

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * __thiscall kj::Path::parent(Path *__return_storage_ptr__,Path *this)

{
  size_t sVar1;
  anon_class_1_0_00000001 local_69;
  ArrayPtr<kj::String> local_68;
  Mapper<kj::ArrayPtr<kj::String>_> local_58;
  Array<kj::String> local_48;
  Fault local_20;
  Fault f;
  Path *this_local;
  
  f.exception = (Exception *)this;
  sVar1 = Array<kj::String>::size(&this->parts);
  if (sVar1 != 0) {
    sVar1 = Array<kj::String>::size(&this->parts);
    local_68 = Array<kj::String>::slice(&this->parts,0,sVar1 - 1);
    _::Mapper<kj::ArrayPtr<kj::String>_>::Mapper(&local_58,&local_68);
    _::Mapper<kj::ArrayPtr<kj::String>_>::
    operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_c__:128:15)>
              (&local_48,&local_58,&local_69);
    Path(__return_storage_ptr__,&local_48,ALREADY_CHECKED);
    Array<kj::String>::~Array(&local_48);
    return __return_storage_ptr__;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x7f,FAILED,"parts.size() > 0","\"root path has no parent\"",
             (char (*) [24])"root path has no parent");
  _::Debug::Fault::fatal(&local_20);
}

Assistant:

Path Path::parent() && {
  KJ_REQUIRE(parts.size() > 0, "root path has no parent");
  return Path(KJ_MAP(p, parts.slice(0, parts.size() - 1)) { return kj::mv(p); }, ALREADY_CHECKED);
}